

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckEmptyLines.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckEmptyLines(Parser *this,unsigned_long max,bool checkEndOfFile)

{
  ulong uVar1;
  long lVar2;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *this_00;
  value_type *__s;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  char *localval;
  size_t length_1;
  Error error;
  bool valid;
  string line;
  unsigned_long empty;
  unsigned_long j;
  unsigned_long i;
  unsigned_long total;
  bool hasError;
  char *val;
  size_t length;
  value_type *__x;
  string local_98 [39];
  byte local_71;
  string local_70 [32];
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  byte local_29;
  char *local_28;
  undefined8 local_20;
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  *(undefined1 *)(in_RDI + 0x45) = 1;
  local_20 = 0xff;
  local_10 = in_RSI;
  local_28 = (char *)operator_new__(0xff);
  snprintf(local_28,0xff,"Empty lines = %ld max lines",local_10);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x2f8),local_28);
  if (local_28 != (char *)0x0) {
    operator_delete__(local_28);
  }
  local_29 = 0;
  local_38 = std::__cxx11::string::size();
  local_40 = 0;
  local_48 = 1;
  local_50 = 0;
  while (local_40 < local_38) {
    std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c2a);
    std::__cxx11::string::substr((ulong)local_70,in_RDI + 0x4f8);
    uVar1 = std::__cxx11::string::length();
    if (uVar1 < 2) {
      local_50 = local_50 + 1;
    }
    else {
      local_50 = 0;
    }
    if (local_10 < local_50) {
      local_71 = 1;
      if (((local_11 & 1) == 0) &&
         (lVar2 = std::__cxx11::string::find_first_not_of((char *)(in_RDI + 0x4f8),0x1e61e5),
         lVar2 == -1)) {
        local_71 = 0;
      }
      if ((local_71 & 1) != 0) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x1b1b47);
        std::__cxx11::string::operator=(local_98,"Empty lines exceed ");
        this_00 = (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)operator_new__(10);
        snprintf((char *)this_00,10,"%ld",local_50);
        std::__cxx11::string::operator+=(local_98,(char *)this_00);
        std::__cxx11::string::operator+=(local_98," (max=");
        if (this_00 != (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)0x0) {
          operator_delete__(this_00);
        }
        __s = (value_type *)operator_new__(10);
        __x = __s;
        snprintf((char *)__s,10,"%ld",local_10);
        std::__cxx11::string::operator+=(local_98,(char *)__s);
        std::__cxx11::string::operator+=(local_98,")");
        if (__s != (value_type *)0x0) {
          operator_delete__(__s);
        }
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back(this_00,__x);
        local_29 = 1;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x1b1ca7);
      }
    }
    local_48 = local_48 + 1;
    lVar2 = std::__cxx11::string::length();
    local_40 = lVar2 + 1 + local_40;
    std::__cxx11::string::~string(local_70);
  }
  return (bool)((local_29 ^ 0xff) & 1);
}

Assistant:

bool Parser::CheckEmptyLines(unsigned long max, bool checkEndOfFile)
{
  m_TestsDone[EMPTYLINES] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Empty lines = %ld max lines",max);
  m_TestsDescription[EMPTYLINES] = val;
  delete [] val;

  bool hasError = false;
  auto total = static_cast<unsigned long>(m_Buffer.size());
  unsigned long i = 0;
  unsigned long j = 1;
  unsigned long empty = 0;
  while(i<total)
    {
    // extract the line
    std::string line = m_Buffer.substr(i+1,m_Buffer.find("\n",i+1)-i-1);

    // if we have \n\r
    if(line.length() <= 1)
      {
      empty++;
      }
    else
      {
      empty = 0;
      }

    if(empty>max)
      {
      bool valid = true;
      // Check if we are at the end of the file
      if(!checkEndOfFile)
        {
        if(m_Buffer.find_first_not_of("\r\n ",i) == std::string::npos)
          {
          valid = false;
          }
        }

      if(valid)
        {
        Error error;
        error.line = j;
        error.line2 = error.line;
        error.number = EMPTYLINES;
        error.description = "Empty lines exceed ";
        constexpr size_t length = 10;
        char* localval = new char[length];
        snprintf(localval,length,"%ld",empty);
        error.description += localval;
        error.description += " (max=";
        delete [] localval;
        localval = new char[length];
        snprintf(localval,length,"%ld",max);
        error.description += localval;
        error.description += ")";
        delete [] localval;
        m_ErrorList.push_back(error);
        hasError = true;
        }
      }
    j++;
    i += static_cast<unsigned long>(line.length())+1;
    }
  return !hasError;
}